

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void check_label_register(Context *ctx,int arg,char *opcode)

{
  int iVar1;
  int iVar2;
  int regnum;
  RegisterType regtype;
  SourceArgInfo *info;
  char *opcode_local;
  int arg_local;
  Context *ctx_local;
  
  iVar1 = ctx->source_args[arg].regnum;
  if (ctx->source_args[arg].regtype != REG_TYPE_LABEL) {
    failf(ctx,"%s with a non-label register specified",opcode);
  }
  iVar2 = shader_version_atleast(ctx,'\x02','\0');
  if (iVar2 == 0) {
    failf(ctx,"%s not supported in Shader Model 1",opcode);
  }
  iVar2 = shader_version_atleast(ctx,'\x02',0xff);
  if ((iVar2 != 0) && (0x7ff < iVar1)) {
    fail(ctx,"label register number must be <= 2047");
  }
  if (0xf < iVar1) {
    fail(ctx,"label register number must be <= 15");
  }
  return;
}

Assistant:

static void check_label_register(Context *ctx, int arg, const char *opcode)
{
    const SourceArgInfo *info = &ctx->source_args[arg];
    const RegisterType regtype = info->regtype;
    const int regnum = info->regnum;

    if (regtype != REG_TYPE_LABEL)
        failf(ctx, "%s with a non-label register specified", opcode);
    if (!shader_version_atleast(ctx, 2, 0))
        failf(ctx, "%s not supported in Shader Model 1", opcode);
    if ((shader_version_atleast(ctx, 2, 255)) && (regnum > 2047))
        fail(ctx, "label register number must be <= 2047");
    if (regnum > 15)
        fail(ctx, "label register number must be <= 15");
}